

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase1651::run(TestCase1651 *this)

{
  ArrayPtr<const_capnp::_::ListReader> lists_00;
  WirePointer *pWVar1;
  PointerType PVar2;
  BuilderArena *arena;
  int iVar3;
  CapTableBuilder *capTable;
  bool bVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  Orphanage OVar7;
  Reader RVar8;
  Reader value;
  Reader value_00;
  Reader value_01;
  Reader value_02;
  Reader value_03;
  Fault f;
  ReaderFor<capnp::List<capnproto_test::capnp::test::TestNewVersion>_> cat;
  Reader lists [2];
  BuilderFor<capnp::List<capnproto_test::capnp::test::TestNewVersion>_> list2;
  BuilderFor<capnp::List<capnproto_test::capnp::test::TestOldVersion>_> list1;
  MallocMessageBuilder message;
  undefined1 local_2c8 [8];
  undefined8 uStack_2c0;
  WirePointer *local_2b8;
  int local_2b0;
  undefined4 uStack_2ac;
  uint local_2a8;
  ushort local_2a4;
  int local_2a0;
  ArrayPtr<const_char> local_298;
  undefined1 local_288 [8];
  undefined8 uStack_280;
  WirePointer *pWStack_278;
  word *local_270;
  undefined1 local_268 [8];
  undefined8 uStack_260;
  WirePointer *local_258;
  ListElementCount local_250;
  BitsPerElementN<23> BStack_24c;
  StructPointerCount local_244;
  int local_240;
  undefined1 local_238 [48];
  ListReader local_208;
  ListBuilder local_1d0;
  OrphanBuilder local_1a8;
  OrphanBuilder local_188;
  OrphanBuilder local_168;
  WirePointer local_148;
  SegmentBuilder *pSStack_140;
  ListBuilder local_130;
  MallocMessageBuilder local_108;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_108,0x400,GROW_HEURISTICALLY);
  OVar7 = MessageBuilder::getOrphanage(&local_108.super_MessageBuilder);
  capTable = OVar7.capTable;
  arena = OVar7.arena;
  OrphanBuilder::initStructList((OrphanBuilder *)local_238,arena,capTable,2,(StructSize)0x20001);
  local_168.segment = (SegmentBuilder *)local_238._8_8_;
  local_168.capTable = (CapTableBuilder *)local_238._16_8_;
  local_168.location = (word *)local_238._24_8_;
  local_168.tag.content = local_238._0_8_;
  OrphanBuilder::asStructList(&local_130,&local_168,(StructSize)0x20001);
  ListBuilder::getStructElement((StructBuilder *)local_238,&local_130,0);
  ((CapTableReader *)local_238._16_8_)->_vptr_CapTableReader = (_func_int **)0xc;
  ListBuilder::getStructElement((StructBuilder *)local_238,&local_130,0);
  local_268 = (undefined1  [8])local_238._0_8_;
  uStack_260 = (SegmentBuilder *)local_238._8_8_;
  local_258 = (WirePointer *)local_238._24_8_;
  RVar8.super_StringPtr.content.size_ = 4;
  RVar8.super_StringPtr.content.ptr = "foo";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)local_268,RVar8);
  ListBuilder::getStructElement((StructBuilder *)local_238,&local_130,1);
  ((CapTableReader *)local_238._16_8_)->_vptr_CapTableReader = (_func_int **)0x22;
  ListBuilder::getStructElement((StructBuilder *)local_238,&local_130,1);
  local_268 = (undefined1  [8])local_238._0_8_;
  uStack_260 = (SegmentBuilder *)local_238._8_8_;
  local_258 = (WirePointer *)local_238._24_8_;
  value.super_StringPtr.content.size_ = 4;
  value.super_StringPtr.content.ptr = "bar";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)local_268,value);
  OrphanBuilder::initStruct((OrphanBuilder *)local_238,arena,capTable,(StructSize)0x10000);
  local_188.segment = (SegmentBuilder *)local_238._8_8_;
  local_188.capTable = (CapTableBuilder *)local_238._16_8_;
  local_188.location = (word *)local_238._24_8_;
  local_188.tag.content = local_238._0_8_;
  OrphanBuilder::asStruct((StructBuilder *)local_238,&local_188,(StructSize)0x10000);
  local_268 = (undefined1  [8])local_238._0_8_;
  uStack_260 = (SegmentBuilder *)local_238._8_8_;
  local_258 = (WirePointer *)local_238._24_8_;
  PointerBuilder::initStructList(&local_1d0,(PointerBuilder *)local_268,2,(StructSize)0x30002);
  ListBuilder::getStructElement((StructBuilder *)local_238,&local_1d0,0);
  ((CapTableReader *)local_238._16_8_)->_vptr_CapTableReader = (_func_int **)0x38;
  ListBuilder::getStructElement((StructBuilder *)local_238,&local_1d0,0);
  local_268 = (undefined1  [8])local_238._0_8_;
  uStack_260 = (SegmentBuilder *)local_238._8_8_;
  local_258 = (WirePointer *)local_238._24_8_;
  value_00.super_StringPtr.content.size_ = 4;
  value_00.super_StringPtr.content.ptr = "baz";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)local_268,value_00);
  ListBuilder::getStructElement((StructBuilder *)local_238,&local_1d0,0);
  (((CapTableBuilder *)(local_238._16_8_ + 8))->super_CapTableReader)._vptr_CapTableReader =
       (_func_int **)0x3a0;
  ListBuilder::getStructElement((StructBuilder *)local_238,&local_1d0,0);
  local_258 = (WirePointer *)(local_238._24_8_ + 0x10);
  local_268 = (undefined1  [8])local_238._0_8_;
  uStack_260 = (SegmentBuilder *)local_238._8_8_;
  value_01.super_StringPtr.content.size_ = 6;
  value_01.super_StringPtr.content.ptr = "corge";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)local_268,value_01);
  ListBuilder::getStructElement((StructBuilder *)local_238,&local_1d0,1);
  ((CapTableReader *)local_238._16_8_)->_vptr_CapTableReader = (_func_int **)0x4e;
  ListBuilder::getStructElement((StructBuilder *)local_238,&local_1d0,1);
  local_268 = (undefined1  [8])local_238._0_8_;
  uStack_260 = (SegmentBuilder *)local_238._8_8_;
  local_258 = (WirePointer *)local_238._24_8_;
  value_02.super_StringPtr.content.size_ = 4;
  value_02.super_StringPtr.content.ptr = "qux";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)local_268,value_02);
  ListBuilder::getStructElement((StructBuilder *)local_238,&local_1d0,1);
  (((CapTableBuilder *)(local_238._16_8_ + 8))->super_CapTableReader)._vptr_CapTableReader =
       (_func_int **)0x213;
  ListBuilder::getStructElement((StructBuilder *)local_238,&local_1d0,1);
  local_258 = (WirePointer *)(local_238._24_8_ + 0x10);
  local_268 = (undefined1  [8])local_238._0_8_;
  uStack_260 = (SegmentBuilder *)local_238._8_8_;
  value_03.super_StringPtr.content.size_ = 7;
  value_03.super_StringPtr.content.ptr = "grault";
  PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)local_268,value_03);
  OrphanBuilder::asListReader((ListReader *)local_238,&local_168,INLINE_COMPOSITE);
  OrphanBuilder::asStructReader((StructReader *)local_268,&local_188,(StructSize)0x10000);
  bVar4 = local_244 == 0;
  local_2b8 = (WirePointer *)CONCAT44(BStack_24c,local_250);
  if (bVar4) {
    local_2b8 = (WirePointer *)0x0;
  }
  local_2b0 = 0x7fffffff;
  if (!bVar4) {
    local_2b0 = local_240;
  }
  local_2c8._0_4_ = 0;
  local_2c8._4_4_ = 0;
  uVar5 = 0;
  uVar6 = 0;
  if (!bVar4) {
    local_2c8._0_4_ = local_268._0_4_;
    local_2c8._4_4_ = local_268._4_4_;
    uVar5 = (undefined4)uStack_260;
    uVar6 = uStack_260._4_4_;
  }
  uStack_2c0 = (SegmentBuilder *)CONCAT44(uVar6,uVar5);
  PointerReader::getList(&local_208,(PointerReader *)local_2c8,INLINE_COMPOSITE,(word *)0x0);
  OrphanBuilder::initStruct((OrphanBuilder *)local_268,arena,capTable,(StructSize)0x10000);
  local_1a8.segment = uStack_260;
  local_1a8.capTable = (CapTableBuilder *)local_258;
  local_1a8.tag.content = (uint64_t)local_268;
  OrphanBuilder::asStruct((StructBuilder *)local_268,&local_1a8,(StructSize)0x10000);
  local_148.offsetAndKind.value = local_268._0_4_;
  local_148.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)local_268._4_4_;
  pSStack_140 = uStack_260;
  pWVar1 = (WirePointer *)CONCAT44(BStack_24c,local_250);
  OVar7 = MessageBuilder::getOrphanage(&local_108.super_MessageBuilder);
  local_298.size_ = 2;
  local_298.ptr = (char *)local_238;
  lists_00.size_ = 2;
  lists_00.ptr = (ListReader *)local_238;
  OrphanBuilder::concat
            ((OrphanBuilder *)local_2c8,OVar7.arena,OVar7.capTable,INLINE_COMPOSITE,
             (StructSize)0x20001,lists_00);
  uStack_280 = uStack_2c0;
  pWStack_278 = local_2b8;
  local_270 = (word *)CONCAT44(uStack_2ac,local_2b0);
  local_288 = local_2c8;
  local_2c8._0_4_ = local_148.offsetAndKind.value;
  local_2c8._4_4_ = local_148.field_1;
  uStack_2c0 = pSStack_140;
  local_2b8 = pWVar1;
  PointerBuilder::adopt((PointerBuilder *)local_2c8,(OrphanBuilder *)local_288);
  if (uStack_280 != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize((OrphanBuilder *)local_288);
  }
  OrphanBuilder::asStructReader((StructReader *)local_2c8,&local_1a8,(StructSize)0x10000);
  bVar4 = local_2a4 == 0;
  pWStack_278 = (WirePointer *)CONCAT44(uStack_2ac,local_2b0);
  if (bVar4) {
    pWStack_278 = (WirePointer *)0x0;
  }
  iVar3 = 0x7fffffff;
  if (!bVar4) {
    iVar3 = local_2a0;
  }
  local_288._0_4_ = 0;
  local_288._4_4_ = 0;
  uVar5 = 0;
  uVar6 = 0;
  if (!bVar4) {
    local_288._0_4_ = local_2c8._0_4_;
    local_288._4_4_ = local_2c8._4_4_;
    uVar5 = (undefined4)uStack_2c0;
    uVar6 = uStack_2c0._4_4_;
  }
  uStack_280 = (SegmentBuilder *)CONCAT44(uVar6,uVar5);
  local_270 = (word *)CONCAT44(local_270._4_4_,iVar3);
  PointerReader::getList
            ((ListReader *)local_268,(PointerReader *)local_288,INLINE_COMPOSITE,(word *)0x0);
  if (local_250 != 4) {
    local_288._0_4_ = 4;
    local_298.ptr._0_4_ = local_250;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,int,unsigned_int>
              ((Fault *)local_2c8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x697,FAILED,"(4) == (cat.size())","4, cat.size()",(int *)local_288,
               (uint *)&local_298);
    kj::_::Debug::Fault::fatal((Fault *)local_2c8);
  }
  ListReader::getStructElement((StructReader *)local_2c8,(ListReader *)local_268,0);
  if (((local_2a8 < 0x40) || (*local_2b8 != (WirePointer)0xc)) && (kj::_::Debug::minSeverity < 3)) {
    local_298.ptr._0_4_ = 0xc;
    ListReader::getStructElement((StructReader *)local_2c8,(ListReader *)local_268,0);
    if (local_2a8 < 0x40) {
      local_288._0_4_ = 0;
      local_288._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
    }
    else {
      local_288 = *(undefined1 (*) [8])local_2b8;
    }
    kj::_::Debug::log<char_const(&)[44],int,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x699,ERROR,
               "\"failed: expected \" \"(12) == (cat[0].getOld1())\", 12, cat[0].getOld1()",
               (char (*) [44])"failed: expected (12) == (cat[0].getOld1())",(int *)&local_298,
               (long *)local_288);
  }
  ListReader::getStructElement((StructReader *)local_2c8,(ListReader *)local_268,0);
  bVar4 = local_2a4 == 0;
  pWStack_278 = (WirePointer *)CONCAT44(uStack_2ac,local_2b0);
  if (bVar4) {
    pWStack_278 = (WirePointer *)0x0;
  }
  iVar3 = 0x7fffffff;
  if (!bVar4) {
    iVar3 = local_2a0;
  }
  local_288._0_4_ = 0;
  local_288._4_4_ = 0;
  uVar5 = 0;
  uVar6 = 0;
  if (!bVar4) {
    local_288._0_4_ = local_2c8._0_4_;
    local_288._4_4_ = local_2c8._4_4_;
    uVar5 = (undefined4)uStack_2c0;
    uVar6 = uStack_2c0._4_4_;
  }
  uStack_280 = (SegmentBuilder *)CONCAT44(uVar6,uVar5);
  local_270._0_4_ = iVar3;
  RVar8 = PointerReader::getBlob<capnp::Text>((PointerReader *)local_288,(void *)0x0,0);
  if (((RVar8.super_StringPtr.content.size_ != 4) ||
      ((char)RVar8.super_StringPtr.content.ptr[1] != 'o' ||
       *RVar8.super_StringPtr.content.ptr != 0x6f66)) && (kj::_::Debug::minSeverity < 3)) {
    ListReader::getStructElement((StructReader *)local_2c8,(ListReader *)local_268,0);
    bVar4 = local_2a4 == 0;
    pWStack_278 = (WirePointer *)CONCAT44(uStack_2ac,local_2b0);
    if (bVar4) {
      pWStack_278 = (WirePointer *)0x0;
    }
    local_270._0_4_ = 0x7fffffff;
    if (!bVar4) {
      local_270._0_4_ = local_2a0;
    }
    local_288._0_4_ = 0;
    local_288._4_4_ = 0;
    uVar5 = 0;
    uVar6 = 0;
    if (!bVar4) {
      local_288._0_4_ = local_2c8._0_4_;
      local_288._4_4_ = local_2c8._4_4_;
      uVar5 = (undefined4)uStack_2c0;
      uVar6 = uStack_2c0._4_4_;
    }
    uStack_280 = (SegmentBuilder *)CONCAT44(uVar6,uVar5);
    local_298 = (ArrayPtr<const_char>)
                PointerReader::getBlob<capnp::Text>((PointerReader *)local_288,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[47],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x69a,ERROR,
               "\"failed: expected \" \"(\\\"foo\\\") == (cat[0].getOld2())\", \"foo\", cat[0].getOld2()"
               ,(char (*) [47])"failed: expected (\"foo\") == (cat[0].getOld2())",
               (char (*) [4])"foo",(Reader *)&local_298);
  }
  ListReader::getStructElement((StructReader *)local_2c8,(ListReader *)local_268,0);
  if (((0x7f < local_2a8) && (local_2b8[1] != (WirePointer)0x0)) && (kj::_::Debug::minSeverity < 3))
  {
    local_298.ptr._0_4_ = 0x3db;
    ListReader::getStructElement((StructReader *)local_2c8,(ListReader *)local_268,0);
    local_288 = (undefined1  [8])0x3db;
    if (0x7f < local_2a8) {
      local_288 = (undefined1  [8])((ulong)local_2b8[1] ^ 0x3db);
    }
    kj::_::Debug::log<char_const(&)[45],int,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x69b,ERROR,
               "\"failed: expected \" \"(987) == (cat[0].getNew1())\", 987, cat[0].getNew1()",
               (char (*) [45])"failed: expected (987) == (cat[0].getNew1())",(int *)&local_298,
               (long *)local_288);
  }
  ListReader::getStructElement((StructReader *)local_2c8,(ListReader *)local_268,0);
  if (local_2a4 < 3) {
    local_288._0_4_ = 0;
    local_288._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
    uStack_280 = (SegmentBuilder *)0x0;
    pWStack_278 = (WirePointer *)0x0;
    iVar3 = 0x7fffffff;
  }
  else {
    pWStack_278 = (WirePointer *)(CONCAT44(uStack_2ac,local_2b0) + 0x10);
    local_288 = local_2c8;
    uStack_280 = uStack_2c0;
    iVar3 = local_2a0;
  }
  local_270 = (word *)CONCAT44(local_270._4_4_,iVar3);
  PVar2 = PointerReader::getPointerType((PointerReader *)local_288);
  if ((PVar2 != NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x69c,ERROR,"\"failed: expected \" \"!(cat[0].hasNew2())\"",
               (char (*) [37])"failed: expected !(cat[0].hasNew2())");
  }
  ListReader::getStructElement((StructReader *)local_2c8,(ListReader *)local_268,1);
  if (((local_2a8 < 0x40) || (*local_2b8 != (WirePointer)0x22)) && (kj::_::Debug::minSeverity < 3))
  {
    local_298.ptr._0_4_ = 0x22;
    ListReader::getStructElement((StructReader *)local_2c8,(ListReader *)local_268,1);
    if (local_2a8 < 0x40) {
      local_288._0_4_ = 0;
      local_288._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
    }
    else {
      local_288 = *(undefined1 (*) [8])local_2b8;
    }
    kj::_::Debug::log<char_const(&)[44],int,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x69e,ERROR,
               "\"failed: expected \" \"(34) == (cat[1].getOld1())\", 34, cat[1].getOld1()",
               (char (*) [44])"failed: expected (34) == (cat[1].getOld1())",(int *)&local_298,
               (long *)local_288);
  }
  ListReader::getStructElement((StructReader *)local_2c8,(ListReader *)local_268,1);
  bVar4 = local_2a4 == 0;
  pWStack_278 = (WirePointer *)CONCAT44(uStack_2ac,local_2b0);
  if (bVar4) {
    pWStack_278 = (WirePointer *)0x0;
  }
  iVar3 = 0x7fffffff;
  if (!bVar4) {
    iVar3 = local_2a0;
  }
  local_288._0_4_ = 0;
  local_288._4_4_ = 0;
  uVar5 = 0;
  uVar6 = 0;
  if (!bVar4) {
    local_288._0_4_ = local_2c8._0_4_;
    local_288._4_4_ = local_2c8._4_4_;
    uVar5 = (undefined4)uStack_2c0;
    uVar6 = uStack_2c0._4_4_;
  }
  uStack_280 = (SegmentBuilder *)CONCAT44(uVar6,uVar5);
  local_270._0_4_ = iVar3;
  RVar8 = PointerReader::getBlob<capnp::Text>((PointerReader *)local_288,(void *)0x0,0);
  if (((RVar8.super_StringPtr.content.size_ != 4) ||
      ((char)RVar8.super_StringPtr.content.ptr[1] != 'r' ||
       *RVar8.super_StringPtr.content.ptr != 0x6162)) && (kj::_::Debug::minSeverity < 3)) {
    ListReader::getStructElement((StructReader *)local_2c8,(ListReader *)local_268,1);
    bVar4 = local_2a4 == 0;
    pWStack_278 = (WirePointer *)CONCAT44(uStack_2ac,local_2b0);
    if (bVar4) {
      pWStack_278 = (WirePointer *)0x0;
    }
    local_270._0_4_ = 0x7fffffff;
    if (!bVar4) {
      local_270._0_4_ = local_2a0;
    }
    local_288._0_4_ = 0;
    local_288._4_4_ = 0;
    uVar5 = 0;
    uVar6 = 0;
    if (!bVar4) {
      local_288._0_4_ = local_2c8._0_4_;
      local_288._4_4_ = local_2c8._4_4_;
      uVar5 = (undefined4)uStack_2c0;
      uVar6 = uStack_2c0._4_4_;
    }
    uStack_280 = (SegmentBuilder *)CONCAT44(uVar6,uVar5);
    local_298 = (ArrayPtr<const_char>)
                PointerReader::getBlob<capnp::Text>((PointerReader *)local_288,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[47],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x69f,ERROR,
               "\"failed: expected \" \"(\\\"bar\\\") == (cat[1].getOld2())\", \"bar\", cat[1].getOld2()"
               ,(char (*) [47])"failed: expected (\"bar\") == (cat[1].getOld2())",
               (char (*) [4])0x2b772e,(Reader *)&local_298);
  }
  ListReader::getStructElement((StructReader *)local_2c8,(ListReader *)local_268,1);
  if (((0x7f < local_2a8) && (local_2b8[1] != (WirePointer)0x0)) && (kj::_::Debug::minSeverity < 3))
  {
    local_298.ptr._0_4_ = 0x3db;
    ListReader::getStructElement((StructReader *)local_2c8,(ListReader *)local_268,1);
    local_288 = (undefined1  [8])0x3db;
    if (0x7f < local_2a8) {
      local_288 = (undefined1  [8])((ulong)local_2b8[1] ^ 0x3db);
    }
    kj::_::Debug::log<char_const(&)[45],int,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x6a0,ERROR,
               "\"failed: expected \" \"(987) == (cat[1].getNew1())\", 987, cat[1].getNew1()",
               (char (*) [45])"failed: expected (987) == (cat[1].getNew1())",(int *)&local_298,
               (long *)local_288);
  }
  ListReader::getStructElement((StructReader *)local_2c8,(ListReader *)local_268,1);
  if (local_2a4 < 3) {
    local_288._0_4_ = 0;
    local_288._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
    uStack_280 = (SegmentBuilder *)0x0;
    pWStack_278 = (WirePointer *)0x0;
    iVar3 = 0x7fffffff;
  }
  else {
    pWStack_278 = (WirePointer *)(CONCAT44(uStack_2ac,local_2b0) + 0x10);
    local_288 = local_2c8;
    uStack_280 = uStack_2c0;
    iVar3 = local_2a0;
  }
  local_270 = (word *)CONCAT44(local_270._4_4_,iVar3);
  PVar2 = PointerReader::getPointerType((PointerReader *)local_288);
  if ((PVar2 != NULL_) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[37]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x6a1,ERROR,"\"failed: expected \" \"!(cat[1].hasNew2())\"",
               (char (*) [37])"failed: expected !(cat[1].hasNew2())");
  }
  ListReader::getStructElement((StructReader *)local_2c8,(ListReader *)local_268,2);
  if (((local_2a8 < 0x40) || (*local_2b8 != (WirePointer)0x38)) && (kj::_::Debug::minSeverity < 3))
  {
    local_298.ptr._0_4_ = 0x38;
    ListReader::getStructElement((StructReader *)local_2c8,(ListReader *)local_268,2);
    if (local_2a8 < 0x40) {
      local_288._0_4_ = 0;
      local_288._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
    }
    else {
      local_288 = *(undefined1 (*) [8])local_2b8;
    }
    kj::_::Debug::log<char_const(&)[44],int,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x6a3,ERROR,
               "\"failed: expected \" \"(56) == (cat[2].getOld1())\", 56, cat[2].getOld1()",
               (char (*) [44])"failed: expected (56) == (cat[2].getOld1())",(int *)&local_298,
               (long *)local_288);
  }
  ListReader::getStructElement((StructReader *)local_2c8,(ListReader *)local_268,2);
  bVar4 = local_2a4 == 0;
  pWStack_278 = (WirePointer *)CONCAT44(uStack_2ac,local_2b0);
  if (bVar4) {
    pWStack_278 = (WirePointer *)0x0;
  }
  iVar3 = 0x7fffffff;
  if (!bVar4) {
    iVar3 = local_2a0;
  }
  local_288._0_4_ = 0;
  local_288._4_4_ = 0;
  uVar5 = 0;
  uVar6 = 0;
  if (!bVar4) {
    local_288._0_4_ = local_2c8._0_4_;
    local_288._4_4_ = local_2c8._4_4_;
    uVar5 = (undefined4)uStack_2c0;
    uVar6 = uStack_2c0._4_4_;
  }
  uStack_280 = (SegmentBuilder *)CONCAT44(uVar6,uVar5);
  local_270._0_4_ = iVar3;
  RVar8 = PointerReader::getBlob<capnp::Text>((PointerReader *)local_288,(void *)0x0,0);
  if (((RVar8.super_StringPtr.content.size_ != 4) ||
      ((char)RVar8.super_StringPtr.content.ptr[1] != 'z' ||
       *RVar8.super_StringPtr.content.ptr != 0x6162)) && (kj::_::Debug::minSeverity < 3)) {
    ListReader::getStructElement((StructReader *)local_2c8,(ListReader *)local_268,2);
    bVar4 = local_2a4 == 0;
    pWStack_278 = (WirePointer *)CONCAT44(uStack_2ac,local_2b0);
    if (bVar4) {
      pWStack_278 = (WirePointer *)0x0;
    }
    local_270._0_4_ = 0x7fffffff;
    if (!bVar4) {
      local_270._0_4_ = local_2a0;
    }
    local_288._0_4_ = 0;
    local_288._4_4_ = 0;
    uVar5 = 0;
    uVar6 = 0;
    if (!bVar4) {
      local_288._0_4_ = local_2c8._0_4_;
      local_288._4_4_ = local_2c8._4_4_;
      uVar5 = (undefined4)uStack_2c0;
      uVar6 = uStack_2c0._4_4_;
    }
    uStack_280 = (SegmentBuilder *)CONCAT44(uVar6,uVar5);
    local_298 = (ArrayPtr<const_char>)
                PointerReader::getBlob<capnp::Text>((PointerReader *)local_288,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[47],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x6a4,ERROR,
               "\"failed: expected \" \"(\\\"baz\\\") == (cat[2].getOld2())\", \"baz\", cat[2].getOld2()"
               ,(char (*) [47])"failed: expected (\"baz\") == (cat[2].getOld2())",
               (char (*) [4])0x2be676,(Reader *)&local_298);
  }
  ListReader::getStructElement((StructReader *)local_2c8,(ListReader *)local_268,2);
  if (((local_2a8 < 0x80) || (local_2b8[1] != (WirePointer)0x3a0)) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_298.ptr._0_4_ = 0x7b;
    ListReader::getStructElement((StructReader *)local_2c8,(ListReader *)local_268,2);
    local_288 = (undefined1  [8])0x3db;
    if (0x7f < local_2a8) {
      local_288 = (undefined1  [8])((ulong)local_2b8[1] ^ 0x3db);
    }
    kj::_::Debug::log<char_const(&)[45],int,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x6a5,ERROR,
               "\"failed: expected \" \"(123) == (cat[2].getNew1())\", 123, cat[2].getNew1()",
               (char (*) [45])"failed: expected (123) == (cat[2].getNew1())",(int *)&local_298,
               (long *)local_288);
  }
  ListReader::getStructElement((StructReader *)local_2c8,(ListReader *)local_268,2);
  pWStack_278 = (WirePointer *)0x0;
  if (2 < local_2a4) {
    pWStack_278 = (WirePointer *)(CONCAT44(uStack_2ac,local_2b0) + 0x10);
  }
  if (2 < local_2a4) {
    local_288._0_4_ = local_2c8._0_4_;
    local_288._4_4_ = local_2c8._4_4_;
    uVar5 = (undefined4)uStack_2c0;
    uVar6 = uStack_2c0._4_4_;
    local_270._0_4_ = local_2a0;
  }
  else {
    local_288._0_4_ = 0;
    local_288._4_4_ = 0;
    uVar5 = 0;
    uVar6 = 0;
    local_270._0_4_ = 0x7fffffff;
  }
  uStack_280 = (SegmentBuilder *)CONCAT44(uVar6,uVar5);
  RVar8 = PointerReader::getBlob<capnp::Text>((PointerReader *)local_288,&DAT_002f2168,3);
  if (((RVar8.super_StringPtr.content.size_ != 6) ||
      ((char)RVar8.super_StringPtr.content.ptr[1] != 'e' ||
       *RVar8.super_StringPtr.content.ptr != 0x67726f63)) && (kj::_::Debug::minSeverity < 3)) {
    ListReader::getStructElement((StructReader *)local_2c8,(ListReader *)local_268,2);
    pWStack_278 = (WirePointer *)0x0;
    if (2 < local_2a4) {
      pWStack_278 = (WirePointer *)(CONCAT44(uStack_2ac,local_2b0) + 0x10);
    }
    if (2 < local_2a4) {
      local_288._0_4_ = local_2c8._0_4_;
      local_288._4_4_ = local_2c8._4_4_;
      uVar5 = (undefined4)uStack_2c0;
      uVar6 = uStack_2c0._4_4_;
      local_270._0_4_ = local_2a0;
    }
    else {
      local_288._0_4_ = 0;
      local_288._4_4_ = 0;
      uVar5 = 0;
      uVar6 = 0;
      local_270._0_4_ = 0x7fffffff;
    }
    uStack_280 = (SegmentBuilder *)CONCAT44(uVar6,uVar5);
    local_298 = (ArrayPtr<const_char>)
                PointerReader::getBlob<capnp::Text>((PointerReader *)local_288,&DAT_002f2168,3);
    kj::_::Debug::log<char_const(&)[49],char_const(&)[6],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x6a6,ERROR,
               "\"failed: expected \" \"(\\\"corge\\\") == (cat[2].getNew2())\", \"corge\", cat[2].getNew2()"
               ,(char (*) [49])"failed: expected (\"corge\") == (cat[2].getNew2())",
               (char (*) [6])"corge",(Reader *)&local_298);
  }
  ListReader::getStructElement((StructReader *)local_2c8,(ListReader *)local_268,3);
  if (((local_2a8 < 0x40) || (*local_2b8 != (WirePointer)0x4e)) && (kj::_::Debug::minSeverity < 3))
  {
    local_298.ptr._0_4_ = 0x4e;
    ListReader::getStructElement((StructReader *)local_2c8,(ListReader *)local_268,3);
    if (local_2a8 < 0x40) {
      local_288._0_4_ = 0;
      local_288._4_4_ = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
    }
    else {
      local_288 = *(undefined1 (*) [8])local_2b8;
    }
    kj::_::Debug::log<char_const(&)[44],int,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x6a8,ERROR,
               "\"failed: expected \" \"(78) == (cat[3].getOld1())\", 78, cat[3].getOld1()",
               (char (*) [44])"failed: expected (78) == (cat[3].getOld1())",(int *)&local_298,
               (long *)local_288);
  }
  ListReader::getStructElement((StructReader *)local_2c8,(ListReader *)local_268,3);
  bVar4 = local_2a4 == 0;
  pWStack_278 = (WirePointer *)CONCAT44(uStack_2ac,local_2b0);
  if (bVar4) {
    pWStack_278 = (WirePointer *)0x0;
  }
  local_270._0_4_ = 0x7fffffff;
  if (!bVar4) {
    local_270._0_4_ = local_2a0;
  }
  local_288._0_4_ = 0;
  local_288._4_4_ = 0;
  uVar5 = 0;
  uVar6 = 0;
  if (!bVar4) {
    local_288._0_4_ = local_2c8._0_4_;
    local_288._4_4_ = local_2c8._4_4_;
    uVar5 = (undefined4)uStack_2c0;
    uVar6 = uStack_2c0._4_4_;
  }
  uStack_280 = (SegmentBuilder *)CONCAT44(uVar6,uVar5);
  RVar8 = PointerReader::getBlob<capnp::Text>((PointerReader *)local_288,(void *)0x0,0);
  if (((RVar8.super_StringPtr.content.size_ != 4) ||
      ((char)RVar8.super_StringPtr.content.ptr[1] != 'x' ||
       *RVar8.super_StringPtr.content.ptr != 0x7571)) && (kj::_::Debug::minSeverity < 3)) {
    ListReader::getStructElement((StructReader *)local_2c8,(ListReader *)local_268,3);
    bVar4 = local_2a4 == 0;
    pWStack_278 = (WirePointer *)CONCAT44(uStack_2ac,local_2b0);
    if (bVar4) {
      pWStack_278 = (WirePointer *)0x0;
    }
    local_270._0_4_ = 0x7fffffff;
    if (!bVar4) {
      local_270._0_4_ = local_2a0;
    }
    local_288._0_4_ = 0;
    local_288._4_4_ = 0;
    uVar5 = 0;
    uVar6 = 0;
    if (!bVar4) {
      local_288._0_4_ = local_2c8._0_4_;
      local_288._4_4_ = local_2c8._4_4_;
      uVar5 = (undefined4)uStack_2c0;
      uVar6 = uStack_2c0._4_4_;
    }
    uStack_280 = (SegmentBuilder *)CONCAT44(uVar6,uVar5);
    local_298 = (ArrayPtr<const_char>)
                PointerReader::getBlob<capnp::Text>((PointerReader *)local_288,(void *)0x0,0);
    kj::_::Debug::log<char_const(&)[47],char_const(&)[4],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x6a9,ERROR,
               "\"failed: expected \" \"(\\\"qux\\\") == (cat[3].getOld2())\", \"qux\", cat[3].getOld2()"
               ,(char (*) [47])"failed: expected (\"qux\") == (cat[3].getOld2())",
               (char (*) [4])0x2c4035,(Reader *)&local_298);
  }
  ListReader::getStructElement((StructReader *)local_2c8,(ListReader *)local_268,3);
  if (((local_2a8 < 0x80) || (local_2b8[1] != (WirePointer)0x213)) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_298.ptr._0_4_ = 0x1c8;
    ListReader::getStructElement((StructReader *)local_2c8,(ListReader *)local_268,3);
    local_288 = (undefined1  [8])0x3db;
    if (0x7f < local_2a8) {
      local_288 = (undefined1  [8])((ulong)local_2b8[1] ^ 0x3db);
    }
    kj::_::Debug::log<char_const(&)[45],int,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x6aa,ERROR,
               "\"failed: expected \" \"(456) == (cat[3].getNew1())\", 456, cat[3].getNew1()",
               (char (*) [45])"failed: expected (456) == (cat[3].getNew1())",(int *)&local_298,
               (long *)local_288);
  }
  ListReader::getStructElement((StructReader *)local_2c8,(ListReader *)local_268,3);
  pWStack_278 = (WirePointer *)0x0;
  if (2 < local_2a4) {
    pWStack_278 = (WirePointer *)(CONCAT44(uStack_2ac,local_2b0) + 0x10);
  }
  if (2 < local_2a4) {
    local_288._0_4_ = local_2c8._0_4_;
    local_288._4_4_ = local_2c8._4_4_;
    uVar5 = (undefined4)uStack_2c0;
    uVar6 = uStack_2c0._4_4_;
    local_270._0_4_ = local_2a0;
  }
  else {
    local_288._0_4_ = 0;
    local_288._4_4_ = 0;
    uVar5 = 0;
    uVar6 = 0;
    local_270._0_4_ = 0x7fffffff;
  }
  uStack_280 = (SegmentBuilder *)CONCAT44(uVar6,uVar5);
  RVar8 = PointerReader::getBlob<capnp::Text>((PointerReader *)local_288,&DAT_002f2168,3);
  if (((RVar8.super_StringPtr.content.size_ != 7) ||
      ((short)RVar8.super_StringPtr.content.ptr[1] != 0x746c ||
       *RVar8.super_StringPtr.content.ptr != 0x75617267)) && (kj::_::Debug::minSeverity < 3)) {
    ListReader::getStructElement((StructReader *)local_2c8,(ListReader *)local_268,3);
    pWStack_278 = (WirePointer *)0x0;
    if (2 < local_2a4) {
      pWStack_278 = (WirePointer *)(CONCAT44(uStack_2ac,local_2b0) + 0x10);
    }
    if (2 < local_2a4) {
      local_288._0_4_ = local_2c8._0_4_;
      local_288._4_4_ = local_2c8._4_4_;
      uVar5 = (undefined4)uStack_2c0;
      uVar6 = uStack_2c0._4_4_;
    }
    else {
      local_288._0_4_ = 0;
      local_288._4_4_ = 0;
      uVar5 = 0;
      uVar6 = 0;
      local_2a0 = 0x7fffffff;
    }
    uStack_280 = (SegmentBuilder *)CONCAT44(uVar6,uVar5);
    local_270._0_4_ = local_2a0;
    local_298 = (ArrayPtr<const_char>)
                PointerReader::getBlob<capnp::Text>((PointerReader *)local_288,&DAT_002f2168,3);
    kj::_::Debug::log<char_const(&)[50],char_const(&)[7],capnp::Text::Reader>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x6ab,ERROR,
               "\"failed: expected \" \"(\\\"grault\\\") == (cat[3].getNew2())\", \"grault\", cat[3].getNew2()"
               ,(char (*) [50])"failed: expected (\"grault\") == (cat[3].getNew2())",
               (char (*) [7])"grault",(Reader *)&local_298);
  }
  if (local_1a8.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_1a8);
  }
  if (local_188.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_188);
  }
  if (local_168.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_168);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_108);
  return;
}

Assistant:

TEST(Orphans, ConcatenateStructLists) {
  // In this test, we not only concatenate two struct lists, but we concatenate in a list that
  // contains a newer-than-expected version of the struct with extra fields, in order to verify
  // that the new fields aren't lost.

  MallocMessageBuilder message;
  auto orphanage = message.getOrphanage();

  auto orphan1 = orphanage.newOrphan<List<test::TestOldVersion>>(2);
  auto list1 = orphan1.get();
  list1[0].setOld1(12);
  list1[0].setOld2("foo");
  list1[1].setOld1(34);
  list1[1].setOld2("bar");

  auto orphan2 = orphanage.newOrphan<test::TestAnyPointer>();
  auto list2 = orphan2.get().getAnyPointerField().initAs<List<test::TestNewVersion>>(2);
  list2[0].setOld1(56);
  list2[0].setOld2("baz");
  list2[0].setNew1(123);
  list2[0].setNew2("corge");
  list2[1].setOld1(78);
  list2[1].setOld2("qux");
  list2[1].setNew1(456);
  list2[1].setNew2("grault");

  List<test::TestOldVersion>::Reader lists[] = {
    orphan1.getReader(),
    orphan2.getReader().getAnyPointerField().getAs<List<test::TestOldVersion>>()
  };
  kj::ArrayPtr<List<test::TestOldVersion>::Reader> array = lists;

  auto orphan3 = orphanage.newOrphan<test::TestAnyPointer>();
  orphan3.get().getAnyPointerField().adopt(message.getOrphanage().newOrphanConcat(array));

  auto cat = orphan3.getReader().getAnyPointerField().getAs<List<test::TestNewVersion>>();
  ASSERT_EQ(4, cat.size());

  EXPECT_EQ(12, cat[0].getOld1());
  EXPECT_EQ("foo", cat[0].getOld2());
  EXPECT_EQ(987, cat[0].getNew1());
  EXPECT_FALSE(cat[0].hasNew2());

  EXPECT_EQ(34, cat[1].getOld1());
  EXPECT_EQ("bar", cat[1].getOld2());
  EXPECT_EQ(987, cat[1].getNew1());
  EXPECT_FALSE(cat[1].hasNew2());

  EXPECT_EQ(56, cat[2].getOld1());
  EXPECT_EQ("baz", cat[2].getOld2());
  EXPECT_EQ(123, cat[2].getNew1());
  EXPECT_EQ("corge", cat[2].getNew2());

  EXPECT_EQ(78, cat[3].getOld1());
  EXPECT_EQ("qux", cat[3].getOld2());
  EXPECT_EQ(456, cat[3].getNew1());
  EXPECT_EQ("grault", cat[3].getNew2());
}